

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::write_sources_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  char *__s;
  CVmFile *this_00;
  CVmFile *in_RSI;
  char *fname;
  size_t len;
  CTcTokFileDesc *desc;
  uint in_stack_ffffffffffffffcc;
  undefined8 local_18;
  
  CTcTokenizer::get_filedesc_count(G_tok);
  CVmFile::write_uint2(in_RSI,in_stack_ffffffffffffffcc);
  for (local_18 = CTcTokenizer::get_first_filedesc(G_tok); local_18 != (CTcTokFileDesc *)0x0;
      local_18 = CTcTokFileDesc::get_next(local_18)) {
    __s = CTcTokFileDesc::get_fname(local_18);
    this_00 = (CVmFile *)strlen(__s);
    CVmFile::write_uint2(in_RSI,in_stack_ffffffffffffffcc);
    CVmFile::write_bytes(this_00,__s,(size_t)in_RSI);
  }
  return;
}

Assistant:

void CTcGenTarg::write_sources_to_object_file(CVmFile *fp)
{
    CTcTokFileDesc *desc;

    /* write the number of entries */
    fp->write_uint2(G_tok->get_filedesc_count());

    /* write the entries */
    for (desc = G_tok->get_first_filedesc() ; desc != 0 ;
         desc = desc->get_next())
    {
        size_t len;
        const char *fname;

        /* get the filename - use the resolved local filename */
        fname = desc->get_fname();

        /* write the length of the filename */
        len = strlen(fname);
        fp->write_uint2(len);

        /* write the filename */
        fp->write_bytes(fname, len);
    }
}